

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_InitFont(stbtt_fontinfo *info,uchar *data2,int fontstart)

{
  stbtt_uint32 sVar1;
  stbtt_uint32 sVar2;
  stbtt_uint32 sVar3;
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  int iVar8;
  ushort uVar9;
  ulong uVar10;
  stbtt_uint32 encoding_record;
  uint uVar11;
  bool bVar12;
  
  info->data = data2;
  info->fontstart = fontstart;
  sVar1 = stbtt__find_table(data2,fontstart,"cmap");
  sVar2 = stbtt__find_table(data2,fontstart,"loca");
  info->loca = sVar2;
  sVar3 = stbtt__find_table(data2,fontstart,"head");
  info->head = sVar3;
  sVar4 = stbtt__find_table(data2,fontstart,"glyf");
  info->glyf = sVar4;
  sVar5 = stbtt__find_table(data2,fontstart,"hhea");
  info->hhea = sVar5;
  sVar6 = stbtt__find_table(data2,fontstart,"hmtx");
  info->hmtx = sVar6;
  sVar7 = stbtt__find_table(data2,fontstart,"kern");
  info->kern = sVar7;
  if ((sVar6 != 0 && sVar5 != 0) && ((sVar4 != 0 && sVar3 != 0) && (sVar2 != 0 && sVar1 != 0))) {
    sVar2 = stbtt__find_table(data2,fontstart,"maxp");
    if (sVar2 == 0) {
      uVar11 = 0xffff;
    }
    else {
      uVar11 = (uint)(ushort)(*(ushort *)(data2 + (ulong)sVar2 + 4) << 8 |
                             *(ushort *)(data2 + (ulong)sVar2 + 4) >> 8);
    }
    info->numGlyphs = uVar11;
    uVar9 = *(ushort *)(data2 + (ulong)sVar1 + 2);
    info->index_map = 0;
    uVar10 = (ulong)(ushort)(uVar9 << 8 | uVar9 >> 8);
    uVar11 = sVar1 + 4;
    iVar8 = 0;
    while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
      uVar9 = *(ushort *)(data2 + uVar11) << 8 | *(ushort *)(data2 + uVar11) >> 8;
      if ((uVar9 == 0) ||
         ((uVar9 == 3 &&
          ((uVar9 = *(ushort *)(data2 + (ulong)uVar11 + 2) << 8 |
                    *(ushort *)(data2 + (ulong)uVar11 + 2) >> 8, uVar9 == 10 || (uVar9 == 1)))))) {
        sVar2 = ttULONG(data2 + (ulong)uVar11 + 4);
        iVar8 = sVar2 + sVar1;
        info->index_map = iVar8;
      }
      uVar11 = uVar11 + 8;
    }
    if (iVar8 != 0) {
      info->indexToLocFormat =
           (uint)(ushort)(*(ushort *)(data2 + (long)(int)sVar3 + 0x32) << 8 |
                         *(ushort *)(data2 + (long)(int)sVar3 + 0x32) >> 8);
      return 1;
    }
  }
  return 0;
}

Assistant:

STBTT_DEF int stbtt_InitFont(stbtt_fontinfo *info, const unsigned char *data2, int fontstart)
{
   stbtt_uint8 *data = (stbtt_uint8 *) data2;
   stbtt_uint32 cmap, t;
   stbtt_int32 i,numTables;

   info->data = data;
   info->fontstart = fontstart;

   cmap = stbtt__find_table(data, fontstart, "cmap");       // required
   info->loca = stbtt__find_table(data, fontstart, "loca"); // required
   info->head = stbtt__find_table(data, fontstart, "head"); // required
   info->glyf = stbtt__find_table(data, fontstart, "glyf"); // required
   info->hhea = stbtt__find_table(data, fontstart, "hhea"); // required
   info->hmtx = stbtt__find_table(data, fontstart, "hmtx"); // required
   info->kern = stbtt__find_table(data, fontstart, "kern"); // not required
   if (!cmap || !info->loca || !info->head || !info->glyf || !info->hhea || !info->hmtx)
      return 0;

   t = stbtt__find_table(data, fontstart, "maxp");
   if (t)
      info->numGlyphs = ttUSHORT(data+t+4);
   else
      info->numGlyphs = 0xffff;

   // find a cmap encoding table we understand *now* to avoid searching
   // later. (todo: could make this installable)
   // the same regardless of glyph.
   numTables = ttUSHORT(data + cmap + 2);
   info->index_map = 0;
   for (i=0; i < numTables; ++i) {
      stbtt_uint32 encoding_record = cmap + 4 + 8 * i;
      // find an encoding we understand:
      switch(ttUSHORT(data+encoding_record)) {
         case STBTT_PLATFORM_ID_MICROSOFT:
            switch (ttUSHORT(data+encoding_record+2)) {
               case STBTT_MS_EID_UNICODE_BMP:
               case STBTT_MS_EID_UNICODE_FULL:
                  // MS/Unicode
                  info->index_map = cmap + ttULONG(data+encoding_record+4);
                  break;
            }
            break;
        case STBTT_PLATFORM_ID_UNICODE:
            // Mac/iOS has these
            // all the encodingIDs are unicode, so we don't bother to check it
            info->index_map = cmap + ttULONG(data+encoding_record+4);
            break;
      }
   }
   if (info->index_map == 0)
      return 0;

   info->indexToLocFormat = ttUSHORT(data+info->head + 50);
   return 1;
}